

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcRobustBufferAccessBehaviorTests.cpp
# Opt level: O1

int __thiscall
deqp::RobustBufferAccessBehaviorTests::init(RobustBufferAccessBehaviorTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  TestNode *pTVar2;
  
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"vertex_buffer_objects",
             "Verifies that out-of-bound reads from VB result in zero");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215c018;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"texel_fetch",
             "Verifies that out-of-bound fetches from texture result in zero");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215c080;
  *(undefined4 *)&pTVar2[1].m_testCtx = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"image_load_store",
             "Verifies that out-of-bound to image result in zero or is discarded");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  *(undefined4 *)&pTVar2[1].m_testCtx = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215c0f0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"storage_buffer",
             "Verifies that out-of-bound access to SSBO is discared or resutls in 0");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215c170;
  *(undefined4 *)&pTVar2[1].m_testCtx = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"uniform_buffer",
             "Verifies that out-of-bound access to UBO resutls in 0");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215c1b8;
  *(undefined4 *)&pTVar2[1].m_testCtx = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  return extraout_EAX;
}

Assistant:

void RobustBufferAccessBehaviorTests::init(void)
{
	addChild(new RobustBufferAccessBehavior::VertexBufferObjectsTest(m_context));
	addChild(new RobustBufferAccessBehavior::TexelFetchTest(m_context));
	addChild(new RobustBufferAccessBehavior::ImageLoadStoreTest(m_context));
	addChild(new RobustBufferAccessBehavior::StorageBufferTest(m_context));
	addChild(new RobustBufferAccessBehavior::UniformBufferTest(m_context));
}